

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::LoadBean::notifyInitWalk<hiberlite::AVisitor<hiberlite::LoadBean>>
          (LoadBean *this,AVisitor<hiberlite::LoadBean> *av)

{
  bool bVar1;
  database_error *this_00;
  longlong *val;
  sqlid_t curId;
  shared_connection local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  SQLiteSelect sel;
  Scope local_110;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string query;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  while ((this->stmt).c.
         super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         (this->stmt).c.
         super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::
    deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
    ::pop_back((deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
                *)this);
  }
  curId = (av->rootKey).id;
  Scope::Scope(&local_110,&av->scope);
  std::__cxx11::string::string((string *)&local_88,(string *)&local_110);
  std::operator+(&local_1c0,"SELECT * FROM ",&local_88);
  std::operator+(&local_1a0,&local_1c0," WHERE ");
  std::operator+(&local_180,&local_1a0,"hiberlite_id");
  std::operator+(&local_160,&local_180,"=");
  Transformer::toSQLiteValue_abi_cxx11_(&local_a8,(Transformer *)&curId,val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sel,
                 &local_160,&local_a8);
  std::operator+(&query,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sel,
                 ";");
  std::__cxx11::string::~string((string *)&sel);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_88);
  Scope::~Scope(&local_110);
  local_1d0._vptr_shared_res = (_func_int **)&PTR__shared_res_0018e7d0;
  local_1d0.res = (av->rootKey).con.res;
  if (local_1d0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_1d0.res)->refCount = (local_1d0.res)->refCount + 1;
  }
  std::__cxx11::string::string((string *)&local_c8,(string *)&query);
  SQLiteSelect::SQLiteSelect(&sel,&local_1d0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_1d0);
  bVar1 = SQLiteSelect::step(&sel);
  if (bVar1) {
    SQLiteSelect::SQLiteSelect((SQLiteSelect *)&local_110,&sel);
    local_110._prefix.field_2._M_allocated_capacity = curId;
    std::
    deque<std::pair<hiberlite::SQLiteSelect,long_long>,std::allocator<std::pair<hiberlite::SQLiteSelect,long_long>>>
    ::emplace_back<std::pair<hiberlite::SQLiteSelect,long_long>>
              ((deque<std::pair<hiberlite::SQLiteSelect,long_long>,std::allocator<std::pair<hiberlite::SQLiteSelect,long_long>>>
                *)this,(pair<hiberlite::SQLiteSelect,_long_long> *)&local_110);
    SQLiteSelect::~SQLiteSelect((SQLiteSelect *)&local_110);
    SQLiteSelect::~SQLiteSelect(&sel);
    std::__cxx11::string::~string((string *)&query);
    return;
  }
  this_00 = (database_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_1a0,curId);
  std::operator+(&local_180,"Id ",&local_1a0);
  std::operator+(&local_160,&local_180," not found in table ");
  Scope::Scope(&local_110,&av->scope);
  std::__cxx11::string::string((string *)&local_1c0,(string *)&local_110);
  std::operator+(&local_48,&local_160,&local_1c0);
  database_error::database_error(this_00,&local_48);
  __cxa_throw(this_00,&database_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LoadBean::notifyInitWalk(AV& av)
{
	while(!stmt.empty())
		stmt.pop();

	sqlid_t curId=av.getRootId();

	std::string query="SELECT * FROM "+av.getScope().table()
						+" WHERE "+HIBERLITE_PRIMARY_KEY_COLUMN+"="+Transformer::toSQLiteValue(curId)+";";

	SQLiteSelect sel(av.getConnection(), query);
	if(!sel.step())
		throw database_error("Id " + std::to_string(curId) + " not found in table " + av.getScope().table());
	stmt.push( std::make_pair(sel,curId) );
}